

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

IVec3 __thiscall deqp::gles31::Functional::defaultImageSize(Functional *this,TextureType type)

{
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int iVar1;
  IVec3 IVar2;
  TextureType type_local;
  
  switch(type) {
  case TEXTURETYPE_2D:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,0x40,0x40,1);
    iVar1 = extraout_EDX_00;
    break;
  case TEXTURETYPE_CUBE:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,0x40,0x40,1);
    iVar1 = extraout_EDX_01;
    break;
  case TEXTURETYPE_2D_ARRAY:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,0x40,0x40,8);
    iVar1 = extraout_EDX_03;
    break;
  case TEXTURETYPE_3D:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,0x40,0x40,8);
    iVar1 = extraout_EDX_02;
    break;
  default:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,-1);
    iVar1 = extraout_EDX_04;
    break;
  case TEXTURETYPE_BUFFER:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,0x40,1,1);
    iVar1 = extraout_EDX;
  }
  IVar2.m_data[2] = iVar1;
  IVar2.m_data._0_8_ = this;
  return (IVec3)IVar2.m_data;
}

Assistant:

static inline IVec3 defaultImageSize (TextureType type)
{
	switch (type)
	{
		case TEXTURETYPE_BUFFER:	return IVec3(64,	1,		1);
		case TEXTURETYPE_2D:		return IVec3(64,	64,		1);
		case TEXTURETYPE_CUBE:		return IVec3(64,	64,		1);
		case TEXTURETYPE_3D:		return IVec3(64,	64,		8);
		case TEXTURETYPE_2D_ARRAY:	return IVec3(64,	64,		8);
		default:
			DE_ASSERT(false);
			return IVec3(-1);
	}
}